

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteFuncRefWrapper(CWriter *this,Func *func)

{
  uint uVar1;
  Index IVar2;
  Newline local_c3;
  CloseBrace local_c2;
  Newline local_c1;
  string_view local_c0;
  string_view local_a8;
  uint local_94;
  undefined1 auStack_90 [4];
  Index i_1;
  ExternalRef local_80;
  string_view local_70;
  OpenBrace local_5d;
  Type local_5c;
  string_view local_50;
  uint local_3c;
  undefined1 auStack_38 [4];
  Index i;
  WrapperRef local_28;
  Func *local_18;
  Func *func_local;
  CWriter *this_local;
  
  local_18 = func;
  func_local = (Func *)this;
  WrapperRef::WrapperRef(&local_28,&func->name);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[8],std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[2],wabt::(anonymous_namespace)::WrapperRef>
            ((CWriter *)this,(char (*) [8])"static ",&(func->decl).sig.result_types,
             (char (*) [2])0x234f67,&local_28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_38,"(void *instance");
  Write(this,_auStack_38);
  IVar2 = Func::GetNumParams(local_18);
  if (IVar2 != 0) {
    Indent(this,4);
    local_3c = 0;
    while( true ) {
      uVar1 = local_3c;
      IVar2 = Func::GetNumParams(local_18);
      if (IVar2 <= uVar1) break;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,", ");
      Write(this,local_50);
      if ((local_3c != 0) && ((local_3c & 7) == 0)) {
        Write(this);
      }
      local_5c = Func::GetParamType(local_18,local_3c);
      (anonymous_namespace)::CWriter::Write<wabt::Type,char_const(&)[2],char_const(&)[5]>
                ((CWriter *)this,&local_5c,(char (*) [2])0x234f67,
                 (char (*) [5])&(anonymous_namespace)::kLocalSymbolPrefix);
      Writef(this,"%d",(ulong)local_3c);
      local_3c = local_3c + 1;
    }
    Dedent(this,4);
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::OpenBrace>
            ((CWriter *)this,(char (*) [3])0x23ce49,&local_5d);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"return ");
  Write(this,local_70);
  ExternalRef::GlobalName(&local_80,Func,&local_18->name);
  Write(this,&local_80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_90,"(instance");
  Write(this,_auStack_90);
  IVar2 = Func::GetNumParams(local_18);
  if (IVar2 != 0) {
    Indent(this,4);
    local_94 = 0;
    while( true ) {
      uVar1 = local_94;
      IVar2 = Func::GetNumParams(local_18);
      if (IVar2 <= uVar1) break;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,", ");
      Write(this,local_a8);
      if ((local_94 != 0) && ((local_94 & 7) == 0)) {
        Write(this);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"var_");
      Write(this,local_c0);
      Writef(this,"%d",(ulong)local_94);
      local_94 = local_94 + 1;
    }
    Dedent(this,4);
  }
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline,wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x239d95,&local_c1,&local_c2,&local_c3);
  return;
}

Assistant:

void CWriter::WriteFuncRefWrapper(const Func* func) {
  Write("static ", func->decl.sig.result_types, " ", WrapperRef(func->name));
  Write("(void *instance");
  if (func->GetNumParams() != 0) {
    Indent(4);
    for (Index i = 0; i < func->GetNumParams(); ++i) {
      Write(", ");
      if (i != 0 && (i % 8) == 0) {
        Write(Newline());
      }
      Write(func->GetParamType(i), " ", kLocalSymbolPrefix);
      Writef("%d", i);
    }
    Dedent(4);
  }
  Write(") ", OpenBrace());
  Write("return ");
  Write(ExternalRef(ModuleFieldType::Func, func->name));
  Write("(instance");
  if (func->GetNumParams() != 0) {
    Indent(4);
    for (Index i = 0; i < func->GetNumParams(); ++i) {
      Write(", ");
      if (i != 0 && (i % 8) == 0) {
        Write(Newline());
      }
      Write(kLocalSymbolPrefix);
      Writef("%d", i);
    }
    Dedent(4);
  }
  Write(");", Newline(), CloseBrace(), Newline());
}